

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListReader * __thiscall
capnp::_::ListBuilder::asReader(ListReader *__return_storage_ptr__,ListBuilder *this)

{
  ElementSize EVar1;
  StructPointerCount SVar2;
  StructDataBitCount SVar3;
  CapTableReader *pCVar4;
  byte *pbVar5;
  ListElementCount LVar6;
  BitsPerElementN<23> BVar7;
  
  pCVar4 = &this->capTable->super_CapTableReader;
  pbVar5 = this->ptr;
  LVar6 = this->elementCount;
  BVar7 = this->step;
  SVar3 = this->structDataSize;
  SVar2 = this->structPointerCount;
  EVar1 = this->elementSize;
  __return_storage_ptr__->segment = &this->segment->super_SegmentReader;
  __return_storage_ptr__->capTable = pCVar4;
  __return_storage_ptr__->ptr = pbVar5;
  __return_storage_ptr__->elementCount = LVar6;
  __return_storage_ptr__->step = BVar7;
  __return_storage_ptr__->structDataSize = SVar3;
  __return_storage_ptr__->structPointerCount = SVar2;
  __return_storage_ptr__->elementSize = EVar1;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader ListBuilder::asReader() const {
  return ListReader(segment, capTable, ptr, elementCount, step, structDataSize, structPointerCount,
                    elementSize, kj::maxValue);
}